

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpoint.h
# Opt level: O1

bool qFuzzyCompare(QPointF *p1,QPointF *p2)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar6 = p1->xp;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    dVar4 = p2->xp;
    if ((dVar4 == 0.0) && (!NAN(dVar4))) goto LAB_002c2467;
    dVar5 = dVar6 - dVar4;
    uVar2 = -(ulong)(dVar5 < -dVar5);
    uVar3 = -(ulong)(dVar6 < -dVar6);
    dVar6 = (double)(~uVar3 & (ulong)dVar6 | (ulong)-dVar6 & uVar3);
    uVar3 = -(ulong)(dVar4 < -dVar4);
    dVar4 = (double)(~uVar3 & (ulong)dVar4 | (ulong)-dVar4 & uVar3);
    if (dVar4 <= dVar6) {
      dVar6 = dVar4;
    }
    if (dVar6 < (double)(~uVar2 & (ulong)dVar5 | (ulong)-dVar5 & uVar2) * 1000000000000.0) {
      return false;
    }
  }
  else {
LAB_002c2467:
    dVar6 = dVar6 - p2->xp;
    uVar2 = -(ulong)(dVar6 < -dVar6);
    if (1e-12 < (double)(~uVar2 & (ulong)dVar6 | (ulong)-dVar6 & uVar2)) {
      return false;
    }
  }
  dVar6 = p1->yp;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    dVar4 = p2->yp;
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      dVar5 = dVar6 - dVar4;
      uVar2 = -(ulong)(dVar5 < -dVar5);
      uVar3 = -(ulong)(dVar6 < -dVar6);
      dVar6 = (double)(~uVar3 & (ulong)dVar6 | (ulong)-dVar6 & uVar3);
      uVar3 = -(ulong)(dVar4 < -dVar4);
      dVar4 = (double)(~uVar3 & (ulong)dVar4 | (ulong)-dVar4 & uVar3);
      if (dVar4 <= dVar6) {
        dVar6 = dVar4;
      }
      bVar1 = dVar6 < (double)(~uVar2 & (ulong)dVar5 | (ulong)-dVar5 & uVar2) * 1000000000000.0;
      goto LAB_002c24d3;
    }
  }
  dVar6 = dVar6 - p2->yp;
  uVar2 = -(ulong)(dVar6 < -dVar6);
  bVar1 = 1e-12 < (double)(~uVar2 & (ulong)dVar6 | (ulong)-dVar6 & uVar2);
LAB_002c24d3:
  return !bVar1;
}

Assistant:

constexpr bool qFuzzyCompare(const QPointF &p1, const QPointF &p2) noexcept
    {
        return ((!p1.xp || !p2.xp) ? qFuzzyIsNull(p1.xp - p2.xp) : qFuzzyCompare(p1.xp, p2.xp))
            && ((!p1.yp || !p2.yp) ? qFuzzyIsNull(p1.yp - p2.yp) : qFuzzyCompare(p1.yp, p2.yp));
    }